

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_valence_decoder.h
# Opt level: O0

void __thiscall
draco::MeshEdgebreakerTraversalValenceDecoder::MeshEdgebreakerTraversalValenceDecoder
          (MeshEdgebreakerTraversalValenceDecoder *this)

{
  long in_RDI;
  MeshEdgebreakerTraversalDecoder *unaff_retaddr;
  
  MeshEdgebreakerTraversalDecoder::MeshEdgebreakerTraversalDecoder(unaff_retaddr);
  *(undefined8 *)(in_RDI + 0xd8) = 0;
  *(undefined4 *)(in_RDI + 0xe0) = 0;
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int>::
  IndexTypeVector((IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int>
                   *)0x170afe);
  *(undefined4 *)(in_RDI + 0x100) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x104) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x108) = 2;
  *(undefined4 *)(in_RDI + 0x10c) = 7;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)0x170b39);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x170b4a);
  return;
}

Assistant:

MeshEdgebreakerTraversalValenceDecoder()
      : corner_table_(nullptr),
        num_vertices_(0),
        last_symbol_(-1),
        active_context_(-1),
        min_valence_(2),
        max_valence_(7) {}